

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O0

CAmount wallet::GenerateChangeTarget
                  (CAmount payment_value,CAmount change_fee,FastRandomContext *rng)

{
  long lVar1;
  long lVar2;
  long in_RSI;
  RandomMixin<FastRandomContext> *in_RDI;
  long in_FS_OFFSET;
  long upper_bound;
  long *in_stack_ffffffffffffffb8;
  long *in_stack_ffffffffffffffc0;
  undefined8 local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((long)in_RDI < 0x61a9) {
    local_18 = in_RSI + 50000;
  }
  else {
    ::_GLOBAL__N_1::std::min<long>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    lVar2 = RandomMixin<FastRandomContext>::randrange<long>(in_RDI,in_RSI);
    local_18 = in_RSI + lVar2 + 50000;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_18;
  }
  __stack_chk_fail();
}

Assistant:

CAmount GenerateChangeTarget(const CAmount payment_value, const CAmount change_fee, FastRandomContext& rng)
{
    if (payment_value <= CHANGE_LOWER / 2) {
        return change_fee + CHANGE_LOWER;
    } else {
        // random value between 50ksat and min (payment_value * 2, 1milsat)
        const auto upper_bound = std::min(payment_value * 2, CHANGE_UPPER);
        return change_fee + rng.randrange(upper_bound - CHANGE_LOWER) + CHANGE_LOWER;
    }
}